

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O1

void __thiscall
QTransposeProxyModelPrivate::onLayoutAboutToBeChanged
          (QTransposeProxyModelPrivate *this,QList<QPersistentModelIndex> *sourceParents,
          LayoutChangeHint hint)

{
  QModelIndexList *this_00;
  QList<QPersistentModelIndex> *this_01;
  QObject *this_02;
  bool bVar1;
  LayoutChangeHint _t2;
  long lVar2;
  QModelIndex *pQVar3;
  QPersistentModelIndex *this_03;
  long in_FS_OFFSET;
  QPersistentModelIndex srcPersistentIndex;
  QPersistentModelIndex local_98;
  QModelIndex local_90;
  QArrayData *local_78;
  QModelIndex *pQStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QPersistentModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QPersistentModelIndex *)0x0;
  local_58.size = 0;
  QList<QPersistentModelIndex>::reserve
            ((QList<QPersistentModelIndex> *)&local_58,(sourceParents->d).size);
  lVar2 = (sourceParents->d).size;
  if (lVar2 != 0) {
    this_03 = (sourceParents->d).ptr;
    lVar2 = lVar2 << 3;
    do {
      bVar1 = QPersistentModelIndex::isValid(this_03);
      if (bVar1) {
        local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pQStack_70 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_03);
        (*this_02->_vptr_QObject[0x33])((QModelIndex *)&local_78,this_02,&local_90);
        QPersistentModelIndex::QPersistentModelIndex
                  ((QPersistentModelIndex *)&local_90,(QModelIndex *)&local_78);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_58,local_58.size,
                   (QPersistentModelIndex *)&local_90);
        QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_58);
        pQVar3 = &local_90;
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_78);
        QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex>
                  ((QMovableArrayOps<QPersistentModelIndex> *)&local_58,local_58.size,
                   (QPersistentModelIndex *)&local_78);
        QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)&local_58);
        pQVar3 = (QModelIndex *)&local_78;
      }
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)pQVar3);
      this_03 = this_03 + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  _t2 = HorizontalSortHint;
  if (hint != VerticalSortHint) {
    _t2 = (uint)(hint == HorizontalSortHint);
  }
  QAbstractItemModel::layoutAboutToBeChanged
            ((QAbstractItemModel *)this_02,(QList<QPersistentModelIndex> *)&local_58,_t2);
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemModel::persistentIndexList
            ((QModelIndexList *)&local_78,(QAbstractItemModel *)this_02);
  this_00 = &this->layoutChangeProxyIndexes;
  QList<QModelIndex>::clear(this_00);
  this_01 = &this->layoutChangePersistentIndexes;
  QList<QPersistentModelIndex>::clear(this_01);
  QList<QModelIndex>::reserve(this_00,(qsizetype)local_68.ptr);
  QList<QPersistentModelIndex>::reserve(this_01,(qsizetype)local_68.ptr);
  if (local_68.ptr != (QAbstractItemModel *)0x0) {
    lVar2 = (long)local_68.ptr * 0x18;
    pQVar3 = pQStack_70;
    do {
      QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                ((QMovableArrayOps<QModelIndex> *)this_00,(this->layoutChangeProxyIndexes).d.size,
                 pQVar3);
      QList<QModelIndex>::end(this_00);
      local_98.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
      (*this_02->_vptr_QObject[0x32])(&local_90,this_02,pQVar3);
      QPersistentModelIndex::QPersistentModelIndex(&local_98,&local_90);
      QtPrivate::QMovableArrayOps<QPersistentModelIndex>::emplace<QPersistentModelIndex_const&>
                ((QMovableArrayOps<QPersistentModelIndex> *)this_01,
                 (this->layoutChangePersistentIndexes).d.size,&local_98);
      QList<QPersistentModelIndex>::end(this_01);
      QPersistentModelIndex::~QPersistentModelIndex(&local_98);
      pQVar3 = pQVar3 + 1;
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != 0);
  }
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,0x18,0x10);
    }
  }
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTransposeProxyModelPrivate::onLayoutAboutToBeChanged(const QList<QPersistentModelIndex> &sourceParents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QTransposeProxyModel);
    QList<QPersistentModelIndex> proxyParents;
    proxyParents.reserve(sourceParents.size());
    for (const QPersistentModelIndex &parent : sourceParents) {
        if (!parent.isValid()) {
            proxyParents << QPersistentModelIndex();
            continue;
        }
        const QModelIndex mappedParent = q->mapFromSource(parent);
        Q_ASSERT(mappedParent.isValid());
        proxyParents << mappedParent;
    }
    QAbstractItemModel::LayoutChangeHint proxyHint = QAbstractItemModel::NoLayoutChangeHint;
    if (hint == QAbstractItemModel::VerticalSortHint)
        proxyHint = QAbstractItemModel::HorizontalSortHint;
    else if (hint == QAbstractItemModel::HorizontalSortHint)
        proxyHint = QAbstractItemModel::VerticalSortHint;
    emit q->layoutAboutToBeChanged(proxyParents, proxyHint);
    const QModelIndexList proxyPersistentIndexes = q->persistentIndexList();
    layoutChangeProxyIndexes.clear();
    layoutChangePersistentIndexes.clear();
    layoutChangeProxyIndexes.reserve(proxyPersistentIndexes.size());
    layoutChangePersistentIndexes.reserve(proxyPersistentIndexes.size());
    for (const QModelIndex &proxyPersistentIndex : proxyPersistentIndexes) {
        layoutChangeProxyIndexes << proxyPersistentIndex;
        Q_ASSERT(proxyPersistentIndex.isValid());
        const QPersistentModelIndex srcPersistentIndex = q->mapToSource(proxyPersistentIndex);
        Q_ASSERT(srcPersistentIndex.isValid());
        layoutChangePersistentIndexes << srcPersistentIndex;
    }
}